

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void __thiscall gnuplotio::Gnuplot::Gnuplot(Gnuplot *this,string *_cmd)

{
  long lVar1;
  uint uVar2;
  GnuplotTmpfileCollection *__p;
  FileHandleWrapper FVar3;
  undefined8 local_28;
  
  std::ios::ios((ios *)&this->field_0xc0);
  FVar3 = open_cmdline(_cmd);
  (this->super_FileHandleWrapper).wrapped_fh = FVar3.wrapped_fh;
  (this->super_FileHandleWrapper).should_use_pclose = FVar3.should_use_pclose;
  *(undefined ***)this = &PTR__Gnuplot_0013d380;
  *(undefined ***)&this->field_0xc0 = &PTR__Gnuplot_0013d3a8;
  uVar2 = FileHandleWrapper::fh_fileno(&this->super_FileHandleWrapper);
  local_28 = (ulong)uVar2 << 0x20;
  boost::iostreams::
  stream<boost::iostreams::file_descriptor_sink,std::char_traits<char>,std::allocator<char>>::
  stream<int,boost::iostreams::file_descriptor_flags>
            ((stream<boost::iostreams::file_descriptor_sink,std::char_traits<char>,std::allocator<char>>
              *)this,&PTR_construction_vtable_24__0013d3c0,(int *)((long)&local_28 + 4),
             (file_descriptor_flags *)&local_28,(type *)0x0);
  *(undefined ***)this = &PTR__Gnuplot_0013d380;
  *(undefined ***)&this->field_0xc0 = &PTR__Gnuplot_0013d3a8;
  this->feedback = (GnuplotFeedback *)0x0;
  __p = (GnuplotTmpfileCollection *)operator_new(0x18);
  (__p->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->tmp_files).
  super__Vector_base<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<gnuplotio::GnuplotTmpfileCollection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<gnuplotio::GnuplotTmpfileCollection,void>
            ((__shared_ptr<gnuplotio::GnuplotTmpfileCollection,(__gnu_cxx::_Lock_policy)2> *)
             &this->tmp_files,__p);
  this->debug_messages = false;
  this->transport_tmpfile = false;
  lVar1 = *(long *)this;
  *(uint *)(&this->field_0x18 + *(long *)(lVar1 + -0x18)) =
       *(uint *)(&this->field_0x18 + *(long *)(lVar1 + -0x18)) & 0xfffffefb;
  *(undefined8 *)(&this->field_0x8 + *(long *)(lVar1 + -0x18)) = 0x11;
  return;
}

Assistant:

explicit Gnuplot(const std::string &_cmd="") :
        FileHandleWrapper(open_cmdline(_cmd)),
        boost::iostreams::stream<boost::iostreams::file_descriptor_sink>(
            fh_fileno(),
#if BOOST_VERSION >= 104400
            boost::iostreams::never_close_handle
#else
            false
#endif
        ),
        feedback(nullptr),
        tmp_files(new GnuplotTmpfileCollection()),
        debug_messages(false),
        transport_tmpfile(false)
    {
        set_stream_options(*this);
    }